

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O3

void deqp::gls::anon_unknown_1::genRandomCoords
               (Random *rng,vector<unsigned_char,_std::allocator<unsigned_char>_> *coords,
               size_t offset,size_t size)

{
  int i;
  deUint32 dVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 local_40;
  undefined4 local_38;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(coords,size);
  if (0 < (int)(uint)size) {
    uVar5 = 0;
    do {
      dVar1 = deRandom_getUint32(&rng->m_rnd);
      (coords->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar5] = ((byte)dVar1 & 3) * 'U';
      uVar5 = uVar5 + 1;
    } while (((uint)size & 0x7fffffff) != uVar5);
  }
  local_40 = CONCAT44(local_40._4_4_,0xffaa5500);
  uVar6 = size + offset;
  uVar5 = 0;
  do {
    uVar4 = (ulong)((uint)*(byte *)((long)&local_40 + uVar5) * 2);
    if (uVar4 < uVar6 && offset <= uVar4) {
      (coords->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar4 - offset] = -((byte)uVar5 & 1);
    }
    uVar4 = uVar4 + 1;
    if (uVar4 < uVar6 && offset <= uVar4) {
      (coords->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar4 - offset] = (uVar5 < 2) + 0xff;
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4);
  local_40 = 0xaa0000aa5555ff00;
  local_38 = 0xff5555;
  iVar3 = 0xc;
  if ((int)uVar6 < 0xc) {
    iVar3 = (int)uVar6;
  }
  if ((int)offset < iVar3) {
    lVar2 = (long)(int)offset;
    do {
      (coords->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar2 - offset] = *(uchar *)((long)&local_40 + lVar2);
      lVar2 = lVar2 + 1;
    } while (iVar3 != lVar2);
  }
  return;
}

Assistant:

void genRandomCoords (de::Random rng, vector<deUint8>& coords, size_t offset, size_t size)
{
	const deUint8 bits		= 2;
	const deUint8 bitMask	= deUint8((0x1u << bits) - 1);

	coords.resize(size);

	for (int i = 0; i < (int)size; i++)
	{
		const deUint8 xBits = deUint8(rng.getUint32() & bitMask);
		coords[i] = extend2BitsToByte(xBits);
	}

	// Fill indices with nice quad
	{
		const deUint8 indices[] =
		{
			extend2BitsToByte(0x0u),
			extend2BitsToByte(0x1u),
			extend2BitsToByte(0x2u),
			extend2BitsToByte(0x3u)
		};

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(indices); i++)
		{
			const deUint8	index	= indices[i];
			const size_t	posX	= (size_t(index) * 2) + 0;
			const size_t	posY	= (size_t(index) * 2) + 1;

			if (posX >= offset && posX < offset+size)
				coords[posX - offset] = ((i % 2) == 0 ? extend2BitsToByte(0x0u) : extend2BitsToByte(0x3u));

			if (posY >= offset && posY < offset+size)
				coords[posY - offset] = ((i / 2) == 1 ? extend2BitsToByte(0x3u) : extend2BitsToByte(0x0u));
		}
	}

	// Fill beginning of buffer
	{
		const deUint8 indices[] =
		{
			extend2BitsToByte(0x0u),
			extend2BitsToByte(0x3u),
			extend2BitsToByte(0x1u),

			extend2BitsToByte(0x1u),
			extend2BitsToByte(0x2u),
			extend2BitsToByte(0x0u),

			extend2BitsToByte(0x0u),
			extend2BitsToByte(0x2u),
			extend2BitsToByte(0x1u),

			extend2BitsToByte(0x1u),
			extend2BitsToByte(0x3u),
			extend2BitsToByte(0x0u)
		};

		for (int i = (int)offset; i < DE_LENGTH_OF_ARRAY(indices) && i < (int)(offset + size); i++)
			coords[i-offset] = indices[i];
	}
}